

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O3

void record_suite::test_struct(void)

{
  person value;
  oarchive ar;
  ostringstream result;
  long *local_250;
  undefined8 local_248;
  undefined1 local_240;
  undefined7 uStack_23f;
  undefined8 uStack_238;
  long *local_230;
  undefined8 local_228;
  long local_220;
  undefined8 uStack_218;
  undefined2 local_210;
  long *local_208 [2];
  long local_1f8 [2];
  basic_oarchive<char> local_1e8;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            (&local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
  local_250 = (long *)&local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Kant","");
  if (local_250 == (long *)&local_240) {
    uStack_218 = uStack_238;
    local_230 = &local_220;
  }
  else {
    local_230 = local_250;
  }
  local_220 = CONCAT71(uStack_23f,local_240);
  local_228 = local_248;
  local_248 = 0;
  local_240 = 0;
  local_210 = 0x7f;
  local_250 = (long *)&local_240;
  boost::serialization::
  singleton<boost::archive::detail::oserializer<trial::protocol::json::basic_oarchive<char>,_record_suite::person>_>
  ::get_instance();
  boost::archive::detail::basic_oarchive::save_object(&local_1e8,(basic_oserializer *)&local_230);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[13]>
            ("result.str()","\"[\\\"Kant\\\",127]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x264,"void record_suite::test_struct()",local_208,"[\"Kant\",127]");
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  local_1e8.super_common_oarchive<trial::protocol::json::basic_oarchive<char>_>._0_8_ =
       &PTR_vsave_001248d0;
  if (local_1e8.writer.stack.c.
      super__Vector_base<trial::protocol::json::basic_writer<char,_16UL>::frame,_std::allocator<trial::protocol::json::basic_writer<char,_16UL>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.writer.stack.c.
                    super__Vector_base<trial::protocol::json::basic_writer<char,_16UL>::frame,_std::allocator<trial::protocol::json::basic_writer<char,_16UL>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.writer.stack.c.
                          super__Vector_base<trial::protocol::json::basic_writer<char,_16UL>::frame,_std::allocator<trial::protocol::json::basic_writer<char,_16UL>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.writer.stack.c.
                          super__Vector_base<trial::protocol::json::basic_writer<char,_16UL>::frame,_std::allocator<trial::protocol::json::basic_writer<char,_16UL>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (**(code **)local_1e8.writer.encoder.storage._0_8_)();
  boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)&local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void test_struct()
{
    std::ostringstream result;
    json::oarchive ar(result);
    person value("Kant", 127);
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[\"Kant\",127]");
}